

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_half_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::ConvertToHalfPass::GenHalfArith(ConvertToHalfPass *this,Instruction *inst)

{
  Instruction *this_00;
  bool bVar1;
  uint32_t uVar2;
  DefUseManager *this_01;
  value_type *__v;
  bool modified;
  bool hasStructOperand;
  Instruction *inst_local;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  modified = false;
  hasStructOperand = false;
  inst_local = inst;
  if (inst->opcode_ == OpCompositeExtract) {
    local_38._M_unused._M_object = &hasStructOperand;
    local_20 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:179:23)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:179:23)>
               ::_M_manager;
    local_38._8_8_ = this;
    Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    if (hasStructOperand == false) goto LAB_0049e24d;
LAB_0049e32f:
    modified = false;
  }
  else {
LAB_0049e24d:
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = ::operator_new(0x18);
    *(Instruction ***)local_38._M_unused._0_8_ = &inst_local;
    *(bool **)((long)local_38._M_unused._0_8_ + 8) = &modified;
    *(ConvertToHalfPass **)((long)local_38._M_unused._0_8_ + 0x10) = this;
    local_20 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:189:21)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/convert_to_half_pass.cpp:189:21)>
               ::_M_manager;
    Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
    bVar1 = IsFloat(this,inst_local,0x20);
    this_00 = inst_local;
    if (bVar1) {
      uVar2 = Instruction::type_id(inst_local);
      uVar2 = EquivFloatTypeId(this,uVar2,0x10);
      Instruction::SetResultType(this_00,uVar2);
      uVar2 = Instruction::result_id(inst_local);
      local_38._0_4_ = uVar2;
      std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((__ireturn_type *)&this->converted_ids_,
               (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)local_38._M_pod_data,__v);
      modified = true;
    }
    else if ((modified & 1U) == 0) goto LAB_0049e32f;
    this_01 = Pass::get_def_use_mgr(&this->super_Pass);
    analysis::DefUseManager::AnalyzeInstUse(this_01,inst_local);
  }
  return (bool)(modified & 1);
}

Assistant:

bool ConvertToHalfPass::GenHalfArith(Instruction* inst) {
  bool modified = false;
  // If this is a OpCompositeExtract instruction and has a struct operand, we
  // should not relax this instruction. Doing so could cause a mismatch between
  // the result type and the struct member type.
  bool hasStructOperand = false;
  if (inst->opcode() == spv::Op::OpCompositeExtract) {
    inst->ForEachInId([&hasStructOperand, this](uint32_t* idp) {
      Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
      if (IsStruct(op_inst)) hasStructOperand = true;
    });
    if (hasStructOperand) {
      return false;
    }
  }
  // Convert all float32 based operands to float16 equivalent and change
  // instruction type to float16 equivalent.
  inst->ForEachInId([&inst, &modified, this](uint32_t* idp) {
    Instruction* op_inst = get_def_use_mgr()->GetDef(*idp);
    if (!IsFloat(op_inst, 32)) return;
    GenConvert(idp, 16, inst);
    modified = true;
  });
  if (IsFloat(inst, 32)) {
    inst->SetResultType(EquivFloatTypeId(inst->type_id(), 16));
    converted_ids_.insert(inst->result_id());
    modified = true;
  }
  if (modified) get_def_use_mgr()->AnalyzeInstUse(inst);
  return modified;
}